

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::ClearBreakpoints(ExecutorX86 *this)

{
  uchar uVar1;
  uint uVar2;
  Breakpoint *pBVar3;
  uchar **ppuVar4;
  uint local_14;
  uint i;
  ExecutorX86 *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::size(&this->breakInstructions);
    if (uVar2 <= local_14) break;
    pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                       (&this->breakInstructions,local_14);
    ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                        (&this->instAddress,pBVar3->instIndex);
    if (**ppuVar4 == 0xcc) {
      pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                         (&this->breakInstructions,local_14);
      uVar1 = pBVar3->oldOpcode;
      pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                         (&this->breakInstructions,local_14);
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->instAddress,pBVar3->instIndex);
      **ppuVar4 = uVar1;
    }
    local_14 = local_14 + 1;
  }
  FastVector<ExecutorX86::Breakpoint,_false,_false>::clear(&this->breakInstructions);
  return;
}

Assistant:

void ExecutorX86::ClearBreakpoints()
{
	for(unsigned i = 0; i < breakInstructions.size(); i++)
	{
		if(*instAddress[breakInstructions[i].instIndex] == 0xcc)
			*instAddress[breakInstructions[i].instIndex] = breakInstructions[i].oldOpcode;
	}
	breakInstructions.clear();
}